

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdir.cpp
# Opt level: O0

void __thiscall QDirSortItem::QDirSortItem(QDirSortItem *this,QFileInfo *fi,SortFlags sort)

{
  long lVar1;
  bool bVar2;
  QFileInfo *in_RDI;
  long in_FS_OFFSET;
  undefined4 in_stack_ffffffffffffff88;
  SortFlag in_stack_ffffffffffffff8c;
  QString *in_stack_ffffffffffffff90;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  QString::QString((QString *)0x28b01b);
  QString::QString((QString *)0x28b02e);
  QFileInfo::QFileInfo
            ((QFileInfo *)in_stack_ffffffffffffff90,
             (QFileInfo *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
  bVar2 = QFlags<QDir::SortFlag>::testAnyFlag
                    ((QFlags<QDir::SortFlag> *)in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c);
  if (bVar2) {
    QFileInfo::suffix(in_RDI);
    QString::operator=(in_stack_ffffffffffffff90,
                       (QString *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
    QString::~QString((QString *)0x28b08f);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

QDirSortItem(const QFileInfo &fi, QDir::SortFlags sort)
        : item(fi)
    {
        // A dir e.g. "dirA.bar" doesn't have actually have an extension/suffix, when
        // sorting by type such "suffix" should be ignored but that would complicate
        // the code and uses can change the behavior by setting DirsFirst/DirsLast
        if (sort.testAnyFlag(QDir::Type))
            suffix_cache = item.suffix();
    }